

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IceAABB.cpp
# Opt level: O0

bool __thiscall IceMaths::AABB::ComputePoints(AABB *this,Point *pts)

{
  float fVar1;
  float fVar2;
  undefined8 local_288;
  undefined8 local_27c;
  undefined8 local_270;
  undefined8 local_264;
  undefined8 local_258;
  undefined8 local_24c;
  undefined8 local_240;
  undefined8 local_234;
  undefined4 local_228;
  undefined4 uStack_224;
  Point max;
  undefined4 local_20c;
  undefined4 uStack_208;
  Point min;
  Point *pts_local;
  AABB *this_local;
  float local_1d4;
  float fStack_1d0;
  float local_1b4;
  float fStack_1b0;
  
  if (pts != (Point *)0x0) {
    fVar1 = (this->mCenter).z - (this->mExtents).z;
    local_1d4 = (this->mCenter).x - (this->mExtents).x;
    fStack_1d0 = (this->mCenter).y - (this->mExtents).y;
    uStack_208 = (undefined4)((ulong)_local_1d4 >> 0x20);
    local_20c = (undefined4)_local_1d4;
    fVar2 = (this->mCenter).z + (this->mExtents).z;
    local_1b4 = (this->mCenter).x + (this->mExtents).x;
    fStack_1b0 = (this->mCenter).y + (this->mExtents).y;
    uStack_224 = (undefined4)((ulong)_local_1b4 >> 0x20);
    local_228 = (undefined4)_local_1b4;
    local_234._0_4_ = local_20c;
    local_234._4_4_ = uStack_208;
    local_234._0_4_ = (undefined4)local_234;
    local_234._4_4_ = SUB84(local_234,4);
    pts->x = (float)(undefined4)local_234;
    pts->y = (float)local_234._4_4_;
    pts->z = fVar1;
    local_240._0_4_ = local_228;
    local_240._4_4_ = uStack_208;
    local_240._0_4_ = (undefined4)local_240;
    local_240._4_4_ = SUB84(local_240,4);
    pts[1].x = (float)(undefined4)local_240;
    pts[1].y = (float)local_240._4_4_;
    pts[1].z = fVar1;
    local_24c._0_4_ = local_228;
    local_24c._4_4_ = uStack_224;
    local_24c._0_4_ = (undefined4)local_24c;
    local_24c._4_4_ = SUB84(local_24c,4);
    pts[2].x = (float)(undefined4)local_24c;
    pts[2].y = (float)local_24c._4_4_;
    pts[2].z = fVar1;
    local_258._0_4_ = local_20c;
    local_258._4_4_ = uStack_224;
    local_258._0_4_ = (undefined4)local_258;
    local_258._4_4_ = SUB84(local_258,4);
    pts[3].x = (float)(undefined4)local_258;
    pts[3].y = (float)local_258._4_4_;
    pts[3].z = fVar1;
    local_264._0_4_ = local_20c;
    local_264._4_4_ = uStack_208;
    local_264._0_4_ = (undefined4)local_264;
    local_264._4_4_ = SUB84(local_264,4);
    pts[4].x = (float)(undefined4)local_264;
    pts[4].y = (float)local_264._4_4_;
    pts[4].z = fVar2;
    local_270._0_4_ = local_228;
    local_270._4_4_ = uStack_208;
    local_270._0_4_ = (undefined4)local_270;
    local_270._4_4_ = SUB84(local_270,4);
    pts[5].x = (float)(undefined4)local_270;
    pts[5].y = (float)local_270._4_4_;
    pts[5].z = fVar2;
    local_27c._0_4_ = local_228;
    local_27c._4_4_ = uStack_224;
    local_27c._0_4_ = (undefined4)local_27c;
    local_27c._4_4_ = SUB84(local_27c,4);
    pts[6].x = (float)(undefined4)local_27c;
    pts[6].y = (float)local_27c._4_4_;
    pts[6].z = fVar2;
    local_288._0_4_ = local_20c;
    local_288._4_4_ = uStack_224;
    local_288._0_4_ = (undefined4)local_288;
    local_288._4_4_ = SUB84(local_288,4);
    pts[7].x = (float)(undefined4)local_288;
    pts[7].y = (float)local_288._4_4_;
    pts[7].z = fVar2;
  }
  return pts != (Point *)0x0;
}

Assistant:

bool AABB::ComputePoints(Point* pts)	const
{
	// Checkings
	if(!pts)	return false;

	// Get box corners
	Point min;	GetMin(min);
	Point max;	GetMax(max);

	//     7+------+6			0 = ---
	//     /|     /|			1 = +--
	//    / |    / |			2 = ++-
	//   / 4+---/--+5			3 = -+-
	// 3+------+2 /    y   z	4 = --+
	//  | /    | /     |  /		5 = +-+
	//  |/     |/      |/		6 = +++
	// 0+------+1      *---x	7 = -++

	// Generate 8 corners of the bbox
	pts[0] = Point(min.x, min.y, min.z);
	pts[1] = Point(max.x, min.y, min.z);
	pts[2] = Point(max.x, max.y, min.z);
	pts[3] = Point(min.x, max.y, min.z);
	pts[4] = Point(min.x, min.y, max.z);
	pts[5] = Point(max.x, min.y, max.z);
	pts[6] = Point(max.x, max.y, max.z);
	pts[7] = Point(min.x, max.y, max.z);

	return true;
}